

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QString * buddyString(QWidget *widget)

{
  bool bVar1;
  QWidget *pQVar2;
  const_iterator o_00;
  QLabel *pQVar3;
  QGroupBox *this;
  QWidget *in_RSI;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  QGroupBox *groupbox;
  QLabel *label;
  QObject *o;
  QObjectList *__range1;
  QWidget *parent;
  const_iterator __end1;
  const_iterator __begin1;
  QLabel *in_stack_ffffffffffffffa8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidget *)0x0) {
    QString::QString((QString *)0x7de339);
  }
  else {
    pQVar2 = QWidget::parentWidget((QWidget *)0x7de348);
    if (pQVar2 == (QWidget *)0x0) {
      QString::QString((QString *)0x7de35e);
    }
    else {
      QObject::children((QObject *)0x7de37c);
      local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<QObject_*>::begin((QList<QObject_*> *)in_RDI);
      o_00 = QList<QObject_*>::end((QList<QObject_*> *)in_RDI);
      while( true ) {
        bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,o_00);
        if (!bVar1) break;
        QList<QObject_*>::const_iterator::operator*(&local_10);
        pQVar3 = qobject_cast<QLabel*>((QObject *)0x7de3f2);
        if (pQVar3 != (QLabel *)0x0) {
          pQVar2 = QLabel::buddy(in_RDI);
          if (pQVar2 == in_RSI) {
            QLabel::text(in_stack_ffffffffffffffa8);
            goto LAB_007de45e;
          }
        }
        QList<QObject_*>::const_iterator::operator++(&local_10);
      }
      this = qobject_cast<QGroupBox*>((QObject *)0x7de438);
      if (this == (QGroupBox *)0x0) {
        QString::QString((QString *)0x7de45e);
      }
      else {
        QGroupBox::title(this);
      }
    }
  }
LAB_007de45e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString buddyString(const QWidget *widget)
{
    if (!widget)
        return QString();
    QWidget *parent = widget->parentWidget();
    if (!parent)
        return QString();
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
    for (QObject *o : parent->children()) {
        QLabel *label = qobject_cast<QLabel*>(o);
        if (label && label->buddy() == widget)
            return label->text();
    }
#endif

#if QT_CONFIG(groupbox)
    QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
    if (groupbox)
        return groupbox->title();
#endif

    return QString();
}